

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

void __thiscall
Minisat::vec<Minisat::vec<unsigned_int,_int>,_int>::clear
          (vec<Minisat::vec<unsigned_int,_int>,_int> *this,bool dealloc)

{
  vec<unsigned_int,_int> *pvVar1;
  void *__ptr;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (this->data != (vec<unsigned_int,_int> *)0x0) {
    iVar2 = this->sz;
    if (0 < iVar2) {
      lVar4 = 0;
      lVar3 = 0;
      do {
        pvVar1 = this->data;
        __ptr = *(void **)((long)&pvVar1->data + lVar4);
        if (__ptr != (void *)0x0) {
          *(undefined4 *)((long)&pvVar1->sz + lVar4) = 0;
          free(__ptr);
          *(undefined8 *)((long)&pvVar1->data + lVar4) = 0;
          *(undefined4 *)((long)&pvVar1->cap + lVar4) = 0;
          iVar2 = this->sz;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar3 < iVar2);
    }
    this->sz = 0;
    if (dealloc) {
      free(this->data);
      this->data = (vec<unsigned_int,_int> *)0x0;
      this->cap = 0;
    }
  }
  return;
}

Assistant:

void vec<T,_Size>::clear(bool dealloc) {
    if (data != NULL){
        for (Size i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) xfree(data), data = NULL, cap = 0; } }